

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void InsertionSort<int>(int *a,int n,int h,_func_bool_int_int *compare)

{
  int iVar1;
  bool local_2d;
  int local_2c;
  int local_28;
  int i;
  int j;
  int temp;
  _func_bool_int_int *compare_local;
  int h_local;
  int n_local;
  int *a_local;
  
  for (local_2c = 0; local_2c < n; local_2c = h + local_2c) {
    local_28 = local_2c;
    iVar1 = a[local_2c];
    while( true ) {
      local_2d = false;
      if (0 < local_28) {
        local_2d = (*compare)(a[local_28 - h],iVar1);
      }
      if (local_2d == false) break;
      a[local_28] = a[local_28 - h];
      local_28 = local_28 - h;
    }
    a[local_28] = iVar1;
  }
  return;
}

Assistant:

inline void InsertionSort(T * a, int n, int h, bool(*compare)(T, T))
{
	int temp, j;
	for (int i = 0; i < n; i += h) {
		j = i;
		temp = a[i];
		while ((j > 0) && compare(a[j - h], temp)) {
			a[j] = a[j - h];
			j -= h;
		}
		a[j] = temp;
	}
}